

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O2

void __thiscall AllRgbWidget::paintEvent(AllRgbWidget *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  int extraout_EDX;
  undefined1 auVar3 [16];
  QPainter p;
  undefined1 local_70 [16];
  double local_60;
  double local_58;
  undefined1 local_50 [16];
  double local_40;
  double local_38;
  
  QPainter::QPainter(&p,(QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10);
  QPainter::save();
  PanAndZoomWidget::TransformPainter(&this->super_PanAndZoomWidget,&p);
  auVar3 = QImage::rect();
  iVar1 = QImage::rect();
  iVar2 = QImage::height();
  local_60 = (double)((auVar3._8_4_ - auVar3._0_4_) + 1);
  local_58 = (double)((auVar3._12_4_ - auVar3._4_4_) + 1);
  local_70._8_8_ = (double)(iVar2 / -2) + (double)auVar3._4_4_;
  local_70._0_8_ = (double)(((extraout_EDX - iVar1) + 1) / -2) + (double)auVar3._0_4_;
  auVar3 = QImage::rect();
  local_50._0_8_ = (undefined8)auVar3._0_4_;
  local_50._8_8_ = (undefined8)auVar3._4_4_;
  local_40 = (double)((auVar3._8_4_ - auVar3._0_4_) + 1);
  local_38 = (double)((auVar3._12_4_ - auVar3._4_4_) + 1);
  QPainter::drawImage(&p,local_70,&this->allRgb_);
  QPainter::restore();
  local_70 = QImage::rect();
  local_50 = QImage::rect();
  QPainter::drawImage(&p,(QRect *)local_70,&this->targetThumbnail_,(QRect *)local_50,
                      (ImageConversionFlags)0x0);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void AllRgbWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);

    p.save();
    // centre the image around the origin
    TransformPainter(p);
    p.drawImage(QRectF(allRgb_.rect()).translated(allRgb_.rect().width() / -2, allRgb_.height() / -2), allRgb_, QRectF(allRgb_.rect()));
    p.restore();

    // draw thumbnail of target
    p.drawImage(targetThumbnail_.rect(), targetThumbnail_, targetThumbnail_.rect());
}